

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O2

unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> __thiscall
qclab::dense::alloc_unique_array<std::complex<double>>(dense *this,int64_t size)

{
  void *__s;
  __uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_> local_20;
  
  if (0 < size) {
    __s = operator_new__(-(ulong)((ulong)size >> 0x3c != 0) | size << 4);
    memset(__s,0,size << 4);
    *(void **)this = __s;
    local_20._M_t.
    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
    super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
         (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
         (_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)0x0
    ;
    std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
    ~unique_ptr((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
                &local_20);
    return (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
            )(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
              )this;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                ,0x12,
                "auto qclab::dense::alloc_unique_array(const int64_t) [T = std::complex<double>]");
}

Assistant:

inline auto alloc_unique_array( const int64_t size ) {
      assert( size > 0 ) ;
      std::unique_ptr< T[] > mem( new T[size] ) ;
      assert( mem.get() != nullptr ) ;
      return mem ;
    }